

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

ggml_status ggml_tallocr_alloc(ggml_tallocr *talloc,ggml_tensor *tensor)

{
  ggml_status gVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  
  sVar2 = ggml_backend_buffer_get_alloc_size(talloc->buffer,tensor);
  uVar5 = -talloc->alignment & (sVar2 + talloc->alignment) - 1;
  sVar2 = talloc->offset;
  sVar3 = ggml_backend_buffer_get_size(talloc->buffer);
  if (sVar2 + uVar5 <= sVar3) {
    pvVar4 = ggml_backend_buffer_get_base(talloc->buffer);
    sVar2 = talloc->offset;
    talloc->offset = uVar5 + sVar2;
    gVar1 = ggml_backend_tensor_alloc(talloc->buffer,tensor,(void *)((long)pvVar4 + sVar2));
    return gVar1;
  }
  sVar2 = ggml_backend_buffer_get_size(talloc->buffer);
  ggml_log_internal(GGML_LOG_LEVEL_ERROR,
                    "%s: not enough space in the buffer to allocate %s (needed %zu, available %zu)\n"
                    ,"ggml_tallocr_alloc",tensor->name,uVar5,sVar2 - talloc->offset);
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c",
             99,"not enough space in the buffer");
}

Assistant:

enum ggml_status ggml_tallocr_alloc(struct ggml_tallocr * talloc, struct ggml_tensor * tensor) {
    size_t size = ggml_backend_buffer_get_alloc_size(talloc->buffer, tensor);
    size = GGML_PAD(size, talloc->alignment);

    if (talloc->offset + size > ggml_backend_buffer_get_size(talloc->buffer)) {
        GGML_LOG_ERROR("%s: not enough space in the buffer to allocate %s (needed %zu, available %zu)\n",
                __func__, tensor->name, size, ggml_backend_buffer_get_size(talloc->buffer) - talloc->offset);
        GGML_ABORT("not enough space in the buffer");
    }

    void * addr = (char *)ggml_backend_buffer_get_base(talloc->buffer) + talloc->offset;
    talloc->offset += size;

    assert(((uintptr_t)addr % talloc->alignment) == 0);

    return ggml_backend_tensor_alloc(talloc->buffer, tensor, addr);
}